

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O2

bool __thiscall xray_re::xr_ini_file::section_exist(xr_ini_file *this,char *sname)

{
  int iVar1;
  __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  _Var2;
  bool bVar3;
  
  _Var2 = lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_section*const*,std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>,xray_re::xr_ini_file::ini_section_pred>
                    ((__normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
                      )(this->m_sections).
                       super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
                      )(this->m_sections).
                       super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(ini_section_pred)sname);
  if (_Var2._M_current ==
      (this->m_sections).
      super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = false;
  }
  else {
    iVar1 = strcasecmp(((*_Var2._M_current)->name)._M_dataplus._M_p,sname);
    bVar3 = iVar1 == 0;
  }
  return bVar3;
}

Assistant:

bool xr_ini_file::section_exist(const char* sname) const
{
	ini_section_vec_cit it = lower_bound_if(m_sections.begin(), m_sections.end(), ini_section_pred(sname));
	return it != m_sections.end() && xr_stricmp((*it)->name.c_str(), sname) == 0;
}